

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hh
# Opt level: O2

void __thiscall
tchecker::make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t>::make_array_t
          (make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *this,
          make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t> *array)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  undefined8 uVar4;
  long lVar5;
  
  uVar3 = (array->super_clockval_base_t).super_array_capacity_t<unsigned_short>._capacity;
  (this->super_clockval_base_t).super_array_capacity_t<unsigned_short>._capacity = uVar3;
  for (lVar5 = 0; (ulong)uVar3 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
    puVar1 = (undefined8 *)(&(array->_fam).field_0x0 + lVar5);
    puVar2 = (undefined8 *)(&(this->_fam).field_0x0 + lVar5);
    uVar4 = puVar1[1];
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
  }
  return;
}

Assistant:

make_array_t(tchecker::make_array_t<T, T_ALLOCSIZE, BASE> const & array) : BASE(array)
  {
    T const * end = end_ptr();
    T const * array_p = array.ptr();
    for (T * p = ptr(); p != end; ++p, ++array_p)
      new (p) T(*array_p);
  }